

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O0

int Abc_NtkMaxFlowFwdPath2_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    pAVar2 = Abc_ObjGetPath(pObj);
    if (pAVar2 == (Abc_Obj_t *)0x0) {
      if ((*(uint *)&pObj->field_0x14 >> 4 & 1) == 0) {
        for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1
            ) {
          pAVar2 = Abc_ObjFanout(pObj,local_2c);
          iVar1 = Abc_NtkMaxFlowFwdPath2_rec(pAVar2);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjSetPath(pObj,pAVar2);
            return iVar1;
          }
        }
        pObj_local._4_4_ = 0;
      }
      else {
        pObj_local._4_4_ = Abc_ObjSetPath(pObj,(Abc_Obj_t *)0x1);
      }
    }
    else {
      pAVar2 = Abc_ObjGetFaninPath(pObj);
      if (pAVar2 == (Abc_Obj_t *)0x0) {
        pObj_local._4_4_ = 0;
      }
      else {
        for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_2c < iVar1;
            local_2c = local_2c + 1) {
          pObj_00 = Abc_ObjFanout(pAVar2,local_2c);
          iVar1 = Abc_NtkMaxFlowFwdPath2_rec(pObj_00);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjSetPath(pAVar2,pObj_00);
            return iVar1;
          }
        }
        iVar1 = Abc_NtkMaxFlowFwdPath2_rec(pAVar2);
        if (iVar1 == 0) {
          pObj_local._4_4_ = 0;
        }
        else {
          pObj_local._4_4_ = Abc_ObjSetPath(pAVar2,(Abc_Obj_t *)0x0);
        }
      }
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkMaxFlowFwdPath2_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout, * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    // process node without flow
    if ( !Abc_ObjGetPath(pObj) )
    { 
        // start the path if we reached a terminal node
        if ( pObj->fMarkA )
            return Abc_ObjSetPath( pObj, (Abc_Obj_t *)1 );
        // explore the fanins
        Abc_ObjForEachFanout( pObj, pFanout, i )
            if ( Abc_NtkMaxFlowFwdPath2_rec(pFanout) )
                return Abc_ObjSetPath( pObj, pFanout );
        return 0;
    }
    // pObj has flow - find the fanout with flow
    pFanin = Abc_ObjGetFaninPath( pObj );
    if ( pFanin == NULL )
        return 0;
    // go through the fanins of the fanout with flow
    Abc_ObjForEachFanout( pFanin, pFanout, i )
        if ( Abc_NtkMaxFlowFwdPath2_rec( pFanout ) )
            return Abc_ObjSetPath( pFanin, pFanout );
    // try the fanout
    if ( Abc_NtkMaxFlowFwdPath2_rec( pFanin ) )
        return Abc_ObjSetPath( pFanin, NULL );
    return 0;
}